

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portal.cpp
# Opt level: O1

void P_ClearPortals(void)

{
  FDisplacement *pFVar1;
  FSectorPortal *pFVar2;
  
  TArray<FDisplacement,_FDisplacement>::Resize(&Displacements.data,1);
  pFVar1 = Displacements.data.Array;
  ((Displacements.data.Array)->pos).X = 0.0;
  (pFVar1->pos).Y = 0.0;
  pFVar1->isSet = false;
  pFVar1->indirect = '\0';
  *(undefined6 *)&pFVar1->field_0x12 = 0;
  Displacements.size = 1;
  if (linePortals.Count != 0) {
    linePortals.Count = 0;
  }
  if (linkedPortals.Count != 0) {
    linkedPortals.Count = 0;
  }
  TArray<FSectorPortal,_FSectorPortal>::Resize(&sectorPortals,2);
  pFVar2 = sectorPortals.Array;
  pFVar2->mType = 0;
  pFVar2->mFlags = 0;
  pFVar2->mPartner = 0;
  pFVar2->mPlane = 0;
  pFVar2->mPlaneZ = 0.0;
  (pFVar2->mSkybox).field_0.p = (AActor *)0x0;
  (pFVar2->mDisplacement).X = 0.0;
  (pFVar2->mDisplacement).Y = 0.0;
  pFVar2->mOrigin = (sector_t *)0x0;
  pFVar2->mDestination = (sector_t *)0x0;
  pFVar2->mFlags = 1;
  pFVar2[1].mType = 0;
  pFVar2[1].mFlags = 0;
  pFVar2[1].mPartner = 0;
  pFVar2[1].mPlane = 0;
  pFVar2[1].mOrigin = (sector_t *)0x0;
  pFVar2[1].mDestination = (sector_t *)0x0;
  pFVar2[1].mDisplacement.X = 0.0;
  pFVar2[1].mDisplacement.Y = 0.0;
  pFVar2[1].mPlaneZ = 0.0;
  pFVar2[1].mSkybox.field_0.p = (AActor *)0x0;
  pFVar2[1].mFlags = 1;
  return;
}

Assistant:

void P_ClearPortals()
{
	Displacements.Create(1);
	linePortals.Clear();
	linkedPortals.Clear();
	sectorPortals.Resize(2);
	// The first entry must always be the default skybox. This is what every sector gets by default.
	memset(&sectorPortals[0], 0, sizeof(sectorPortals[0]));
	sectorPortals[0].mType = PORTS_SKYVIEWPOINT;
	sectorPortals[0].mFlags = PORTSF_SKYFLATONLY;
	// The second entry will be the default sky. This is for forcing a regular sky through the skybox picker
	memset(&sectorPortals[1], 0, sizeof(sectorPortals[0]));
	sectorPortals[1].mType = PORTS_SKYVIEWPOINT;
	sectorPortals[1].mFlags = PORTSF_SKYFLATONLY;
}